

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_write_db_header(Pager *pPager)

{
  sxu32 sVar1;
  sxu32 local_24;
  sxu16 nLen;
  unqlite_kv_engine *puStack_20;
  sxu32 nDos;
  unqlite_kv_engine *pEngine;
  uchar *zRaw;
  Pager *pPager_local;
  
  pEngine = (unqlite_kv_engine *)pPager->pHeader->zData;
  puStack_20 = pPager->pEngine;
  zRaw = (uchar *)pPager;
  SyMemcpy("unqlite",pEngine,7);
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 7);
  SyBigEndianPack32((uchar *)pEngine,0xdb7c2712);
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 4);
  SyZero(zRaw + 0x1a8,0x38);
  if (*(long *)(*(long *)(zRaw + 0x28) + 0x48) != 0) {
    (**(code **)(*(long *)(zRaw + 0x28) + 0x48))(*(undefined8 *)(zRaw + 0x28),zRaw + 0x1a8);
  }
  SyTimeFormatToDos((Sytm *)(zRaw + 0x1a8),&local_24);
  SyBigEndianPack32((uchar *)pEngine,local_24);
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 4);
  SyBigEndianPack32((uchar *)pEngine,*(sxu32 *)(zRaw + 0x20c));
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 4);
  SyBigEndianPack32((uchar *)pEngine,*(sxu32 *)(zRaw + 0x208));
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 4);
  sVar1 = SyStrlen(puStack_20->pIo->pMethods->zName);
  SyBigEndianPack16((uchar *)pEngine,(sxu16)sVar1);
  pEngine = (unqlite_kv_engine *)((long)&pEngine->pIo + 2);
  SyMemcpy(puStack_20->pIo->pMethods->zName,pEngine,sVar1 & 0xffff);
  return 0;
}

Assistant:

static int pager_write_db_header(Pager *pPager)
{
	unsigned char *zRaw = pPager->pHeader->zData;
	unqlite_kv_engine *pEngine = pPager->pEngine;
	sxu32 nDos;
	sxu16 nLen;
	/* Database signature */
	SyMemcpy(UNQLITE_DB_SIG,zRaw,sizeof(UNQLITE_DB_SIG)-1);
	zRaw += sizeof(UNQLITE_DB_SIG)-1;
	/* Database magic number */
	SyBigEndianPack32(zRaw,UNQLITE_DB_MAGIC);
	zRaw += 4; /* 4 byte magic number */
	/* Database creation time */
	SyZero(&pPager->tmCreate,sizeof(Sytm));
	if( pPager->pVfs->xCurrentTime ){
		pPager->pVfs->xCurrentTime(pPager->pVfs,&pPager->tmCreate);
	}
	/* DOS time format (4 bytes) */
	SyTimeFormatToDos(&pPager->tmCreate,&nDos);
	SyBigEndianPack32(zRaw,nDos);
	zRaw += 4; /* 4 byte DOS time */
	/* Sector size */
	SyBigEndianPack32(zRaw,(sxu32)pPager->iSectorSize);
	zRaw += 4; /* 4 byte sector size */
	/* Page size */
	SyBigEndianPack32(zRaw,(sxu32)pPager->iPageSize);
	zRaw += 4; /* 4 byte page size */
	/* Key value storage engine */
	nLen = (sxu16)SyStrlen(pEngine->pIo->pMethods->zName);
	SyBigEndianPack16(zRaw,nLen); /* 2 byte storage engine name */
	zRaw += 2;
	SyMemcpy((const void *)pEngine->pIo->pMethods->zName,(void *)zRaw,nLen);
	zRaw += nLen;
	/* All rest are meta-data available to the host application */
	return UNQLITE_OK;
}